

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O0

void __thiscall Linker::~Linker(Linker *this)

{
  Linker *this_local;
  
  CleanCode(this);
  FastVector<unsigned_char,_false,_false>::~FastVector(&this->fullLinkerData);
  HashMap<unsigned_int>::~HashMap(&this->funcMap);
  HashMap<unsigned_int>::~HashMap(&this->typeMap);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->moduleRemap);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->funcRemap);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->typeRemap);
  FastVector<unsigned_int_*,_false,_false>::~FastVector(&this->expiredRegVmConstants);
  FastVector<RegVmCmd_*,_false,_false>::~FastVector(&this->expiredRegVmCode);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->regVmJumpTargets);
  FastVector<unsigned_char,_false,_false>::~FastVector(&this->exRegVmRegKillInfo);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->exRegVmConstants);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->exRegVmExecCount);
  FastVector<ExternSourceInfo,_false,_false>::~FastVector(&this->exRegVmSourceInfo);
  FastVector<RegVmCmd,_false,_false>::~FastVector(&this->exRegVmCode);
  FastVector<char,_false,_false>::~FastVector(&this->exMainModuleName);
  FastVector<char,_false,_false>::~FastVector(&this->exImportPaths);
  FastVector<char,_false,_false>::~FastVector(&this->exSource);
  FastVector<char,_false,_false>::~FastVector(&this->exSymbols);
  FastVector<ExternModuleInfo,_false,_false>::~FastVector(&this->exModules);
  FastVector<ExternLocalInfo,_false,_false>::~FastVector(&this->exLocals);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->exFunctionExplicitTypes);
  FastVector<unsigned_int,_false,_false>::~FastVector(&this->exFunctionExplicitTypeArrayOffsets);
  FastVector<ExternFuncInfo,_false,_false>::~FastVector(&this->exFunctions);
  FastVector<ExternVarInfo,_false,_false>::~FastVector(&this->exVariables);
  FastVector<ExternConstantInfo,_false,_false>::~FastVector(&this->exTypeConstants);
  FastVector<ExternMemberInfo,_false,_false>::~FastVector(&this->exTypeExtra);
  FastVector<ExternTypeInfo,_false,_false>::~FastVector(&this->exTypes);
  return;
}

Assistant:

Linker::~Linker()
{
	CleanCode();
}